

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandFraigSweep(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint local_44;
  uint local_40;
  int fVeryVerbose;
  int fVerbose;
  int fExdc;
  int fUseInv;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  fVerbose = 1;
  fVeryVerbose = 0;
  local_40 = 0;
  local_44 = 0;
  Extra_UtilGetoptReset();
LAB_0023dbf3:
  iVar1 = Extra_UtilGetopt(argc,argv,"ievwh");
  if (iVar1 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar1 = Abc_NtkIsStrash(pNtk_00);
      if (iVar1 == 0) {
        iVar1 = Abc_NtkIsLogic(pNtk_00);
        if (iVar1 == 0) {
          Abc_Print(-1,"Transform the current network into a logic network.\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          iVar1 = Abc_NtkFraigSweep(pNtk_00,fVerbose,fVeryVerbose,local_40,local_44);
          if (iVar1 == 0) {
            Abc_Print(-1,"Sweeping has failed.\n");
            pAbc_local._4_4_ = 1;
          }
          else {
            pAbc_local._4_4_ = 0;
          }
        }
      }
      else {
        Abc_Print(-1,"Cannot sweep AIGs (use \"fraig\").\n");
        pAbc_local._4_4_ = 1;
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar1) {
  case 0x65:
    fVeryVerbose = fVeryVerbose ^ 1;
    goto LAB_0023dbf3;
  default:
    break;
  case 0x68:
    break;
  case 0x69:
    fVerbose = fVerbose ^ 1;
    goto LAB_0023dbf3;
  case 0x76:
    local_40 = local_40 ^ 1;
    goto LAB_0023dbf3;
  case 0x77:
    goto switchD_0023dc31_caseD_77;
  }
  Abc_Print(-2,"usage: fraig_sweep [-evwh]\n");
  Abc_Print(-2,"\t        performs technology-dependent sweep\n");
  pcVar2 = "no";
  if (fVeryVerbose != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-e    : toggle functional sweeping using EXDC [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_40 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v    : prints verbose information [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (local_44 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-w    : prints equivalence class information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
switchD_0023dc31_caseD_77:
  local_44 = local_44 ^ 1;
  goto LAB_0023dbf3;
}

Assistant:

int Abc_CommandFraigSweep( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fUseInv;
    int fExdc;
    int fVerbose;
    int fVeryVerbose;
    extern int Abc_NtkFraigSweep( Abc_Ntk_t * pNtk, int fUseInv, int fExdc, int fVerbose, int fVeryVerbose );
    // set defaults
    fUseInv   = 1;
    fExdc     = 0;
    fVerbose  = 0;
    fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ievwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'i':
            fUseInv ^= 1;
            break;
        case 'e':
            fExdc ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Cannot sweep AIGs (use \"fraig\").\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "Transform the current network into a logic network.\n" );
        return 1;
    }
    // modify the current network
    if ( !Abc_NtkFraigSweep( pNtk, fUseInv, fExdc, fVerbose, fVeryVerbose ) )
    {
        Abc_Print( -1, "Sweeping has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: fraig_sweep [-evwh]\n" );
    Abc_Print( -2, "\t        performs technology-dependent sweep\n" );
    Abc_Print( -2, "\t-e    : toggle functional sweeping using EXDC [default = %s]\n", fExdc? "yes": "no" );
    Abc_Print( -2, "\t-v    : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w    : prints equivalence class information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}